

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O3

bool __thiscall VanEmdeBoasTree::find(VanEmdeBoasTree *this,Node *root,int value)

{
  Node **ppNVar1;
  Node *pNVar2;
  double dVar3;
  
  if (value < 0 || root == (Node *)0x0) {
    return false;
  }
  while( true ) {
    if (root->uni <= value) {
      return false;
    }
    if (value < root->min) {
      return false;
    }
    if (root->max < value) {
      return false;
    }
    if (root->min == value) break;
    if (root->summary == (Node *)0x0) {
      return root->max == value;
    }
    ppNVar1 = root->cluster;
    dVar3 = log2((double)root->uni);
    dVar3 = floor(dVar3 * 0.5);
    dVar3 = exp2(dVar3);
    pNVar2 = ppNVar1[(int)((float)value / (float)dVar3)];
    dVar3 = log2((double)root->uni);
    dVar3 = floor(dVar3 * 0.5);
    dVar3 = exp2(dVar3);
    value = value % (int)dVar3;
    root = pNVar2;
    if (pNVar2 == (Node *)0x0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool VanEmdeBoasTree::find(Node *root, int value) {
    if (!root) {
        return false;
    }

    if (value < 0 || value >= root->uni) {
        return false;
    }
    if (root->min > value || root->max < value) {
        return false;
    }
    if (root->min == value) {
        return true;
    }
    if (!root->summary) {
        return root->max == value;
    }
    return find(root->cluster[high(root, value)], low(root, value));
}